

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

char * wabt::GetTypeName(Type type)

{
  char *pcStack_10;
  Type type_local;
  
  switch(type) {
  case Any:
    pcStack_10 = "any";
    break;
  case Void:
    pcStack_10 = "void";
    break;
  default:
    pcStack_10 = "<type index>";
    break;
  case Func:
    pcStack_10 = "func";
    break;
  case ExceptRef:
    pcStack_10 = "except_ref";
    break;
  case Anyfunc:
    pcStack_10 = "anyfunc";
    break;
  case V128:
    pcStack_10 = "v128";
    break;
  case F64:
    pcStack_10 = "f64";
    break;
  case F32:
    pcStack_10 = "f32";
    break;
  case I64:
    pcStack_10 = "i64";
    break;
  case I32:
    pcStack_10 = "i32";
  }
  return pcStack_10;
}

Assistant:

static WABT_INLINE const char* GetTypeName(Type type) {
  switch (type) {
    case Type::I32:
      return "i32";
    case Type::I64:
      return "i64";
    case Type::F32:
      return "f32";
    case Type::F64:
      return "f64";
    case Type::V128:
      return "v128";
    case Type::Anyfunc:
      return "anyfunc";
    case Type::Func:
      return "func";
    case Type::ExceptRef:
      return "except_ref";
    case Type::Void:
      return "void";
    case Type::Any:
      return "any";
    default:
      return "<type index>";
  }
  WABT_UNREACHABLE;
}